

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Block::GetTime(Block *this,Cluster *pCluster)

{
  undefined1 auVar1 [16];
  longlong lVar2;
  SegmentInfo *this_00;
  longlong lVar3;
  longlong ns;
  longlong scale;
  SegmentInfo *pInfo;
  Segment *pSegment;
  longlong tc;
  Cluster *pCluster_local;
  Block *this_local;
  
  if (pCluster == (Cluster *)0x0) {
    __assert_fail("pCluster",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f54,"long long mkvparser::Block::GetTime(const Cluster *) const");
  }
  lVar2 = GetTimeCode(this,pCluster);
  this_00 = Segment::GetInfo(pCluster->m_pSegment);
  if (this_00 != (SegmentInfo *)0x0) {
    lVar3 = SegmentInfo::GetTimeCodeScale(this_00);
    if (0 < lVar3) {
      if ((lVar2 == 0) ||
         (auVar1._8_8_ = 0, auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8),
         lVar3 <= SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar2),0))) {
        this_local = (Block *)(lVar2 * lVar3);
      }
      else {
        this_local = (Block *)0xffffffffffffffff;
      }
      return (longlong)this_local;
    }
    __assert_fail("scale >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f5d,"long long mkvparser::Block::GetTime(const Cluster *) const");
  }
  __assert_fail("pInfo",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1f5a,"long long mkvparser::Block::GetTime(const Cluster *) const");
}

Assistant:

long long Block::GetTime(const Cluster* pCluster) const {
  assert(pCluster);

  const long long tc = GetTimeCode(pCluster);

  const Segment* const pSegment = pCluster->m_pSegment;
  const SegmentInfo* const pInfo = pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  // Check if tc * scale could overflow.
  if (tc != 0 && scale > LLONG_MAX / tc) {
    return -1;
  }
  const long long ns = tc * scale;

  return ns;
}